

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int TrellisQuantizeBlock
              (VP8Encoder *enc,int16_t *in,int16_t *out,int ctx0,int coeff_type,VP8Matrix *mtx,
              int lambda)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint16_t *puVar5;
  uint uVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long *plVar15;
  ushort uVar16;
  ulong uVar17;
  bool bVar18;
  char cVar19;
  long lVar20;
  int iVar21;
  long *plVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  Node nodes [16] [2];
  long local_170;
  int local_160;
  uint local_15c;
  long local_f8 [8];
  char acStack_b8 [2];
  ushort auStack_b6 [67];
  
  bVar30 = coeff_type == 0;
  uVar9 = (ulong)bVar30;
  uVar27 = (uint)bVar30;
  bVar2 = *(byte *)((long)(enc->proba_).coeffs_[(uint)coeff_type][0] +
                   (long)ctx0 * 0xb + (ulong)""[uVar9] * 0x20 + (ulong)""[uVar9]);
  iVar21 = -(uint)!bVar30;
  uVar11 = 0x10;
  do {
    uVar25 = uVar11 - 1;
    if ((uint)mtx->q_[1] * (uint)mtx->q_[1] >> 2 < (uint)((int)in[""[uVar25]] * (int)in[""[uVar25]])
       ) {
      iVar21 = uVar11 - 1;
      break;
    }
    uVar11 = uVar25;
  } while (uVar27 < uVar25);
  uVar10 = VP8EntropyCost[bVar2];
  lVar7 = (long)lambda;
  puVar5 = (enc->proba_).remapped_costs_[(uint)coeff_type][uVar9][ctx0];
  plVar22 = local_f8;
  bVar30 = true;
  do {
    bVar18 = bVar30;
    if (ctx0 == 0) {
      uVar13 = (ulong)VP8EntropyCost[(byte)~bVar2];
    }
    else {
      uVar13 = 0;
    }
    *plVar22 = uVar13 * lVar7;
    plVar22[1] = (long)puVar5;
    plVar22 = local_f8 + 2;
    bVar30 = false;
  } while (bVar18);
  iVar21 = iVar21 + (uint)(iVar21 < 0xf);
  if (iVar21 < (int)uVar27) {
    cVar19 = -1;
    local_15c = 0xffffffff;
    local_160 = -1;
  }
  else {
    local_170 = (ulong)uVar10 * lVar7;
    cVar19 = -1;
    local_160 = -1;
    local_15c = 0xffffffff;
    plVar22 = local_f8;
    plVar15 = local_f8 + 4;
    do {
      plVar8 = plVar22;
      bVar2 = ""[uVar9];
      uVar13 = (ulong)((uint)bVar2 * 2);
      uVar10 = *(ushort *)((long)mtx->q_ + uVar13);
      uVar4 = *(ushort *)((long)in + uVar13);
      uVar16 = -uVar4;
      if (0 < (short)uVar4) {
        uVar16 = uVar4;
      }
      iVar12 = (uint)*(ushort *)((long)mtx->sharpen_ + uVar13) + (uint)uVar16;
      uVar11 = (uint)*(ushort *)((long)mtx->iq_ + uVar13) * iVar12;
      uVar25 = uVar11 >> 0x11;
      uVar11 = uVar11 + 0x10000 >> 0x11;
      if (0x7fe < uVar11) {
        uVar11 = 0x7ff;
      }
      if (0x7fe < uVar25) {
        uVar25 = 0x7ff;
      }
      uVar13 = uVar9 + 1;
      bVar3 = ""[uVar9 + 1];
      lVar14 = 0;
      bVar30 = true;
      do {
        bVar18 = bVar30;
        uVar26 = lVar14 + (ulong)uVar25;
        uVar28 = (uint)uVar26;
        uVar29 = 2;
        if (uVar28 < 2) {
          uVar29 = uVar26;
        }
        plVar15[lVar14 * 2 + 1] =
             (long)(enc->proba_).remapped_costs_[(uint)coeff_type][uVar9 + 1][uVar29];
        if (uVar11 < uVar26) {
          plVar15[lVar14 * 2] = 0x7fffffffffffff;
        }
        else {
          uVar6 = (uint)uVar10;
          uVar16 = kWeightTrellis[bVar2];
          uVar17 = 0x43;
          if (uVar28 < 0x43) {
            uVar17 = uVar26;
          }
          lVar20 = (ulong)((uint)*(ushort *)(plVar8[1] + uVar17 * 2) +
                          (uint)VP8LevelFixedCosts[uVar26]) * lVar7 + *plVar8;
          lVar23 = (ulong)((uint)*(ushort *)(plVar8[3] + uVar17 * 2) +
                          (uint)VP8LevelFixedCosts[uVar26]) * lVar7 + plVar8[2];
          lVar24 = lVar23;
          if (lVar20 <= lVar23) {
            lVar24 = lVar20;
          }
          lVar1 = uVar9 * 8;
          acStack_b8[lVar14 * 4 + lVar1] = lVar23 < lVar20;
          lVar24 = lVar24 + (long)(int)((uint)uVar16 *
                                       ((uVar25 + (int)lVar14) * uVar6 + iVar12 * -2) *
                                       uVar28 * uVar6) * 0x100;
          acStack_b8[lVar14 * 4 + lVar1 + 1] = (byte)(uVar4 >> 0xf);
          *(short *)(acStack_b8 + lVar14 * 4 + lVar1 + 2) = (short)uVar26;
          plVar15[lVar14 * 2] = lVar24;
          if ((uVar26 != 0) && (lVar24 < local_170)) {
            if (uVar9 < 0xf) {
              uVar26 = (ulong)VP8EntropyCost
                              [*(byte *)((long)(enc->proba_).coeffs_[(uint)coeff_type][0] +
                                        uVar29 * 0xb + (ulong)bVar3 * 0x20 + (ulong)bVar3)];
            }
            else {
              uVar26 = 0;
            }
            lVar24 = uVar26 * lVar7 + lVar24;
            if (lVar24 < local_170) {
              local_15c = (uint)uVar9;
              local_170 = lVar24;
              local_160 = (int)lVar14;
              cVar19 = lVar23 < lVar20;
            }
          }
        }
        lVar14 = 1;
        bVar30 = false;
      } while (bVar18);
      plVar22 = plVar15;
      plVar15 = plVar8;
      uVar9 = uVar13;
    } while (uVar13 != iVar21 + 1);
  }
  if (coeff_type == 0) {
    in[8] = 0;
    in[9] = 0;
    in[10] = 0;
    in[0xb] = 0;
    in[0xc] = 0;
    in[0xd] = 0;
    in[0xe] = 0;
    in[0xf] = 0;
    in[1] = 0;
    in[2] = 0;
    in[3] = 0;
    in[4] = 0;
    in[5] = 0;
    in[6] = 0;
    in[7] = 0;
    in[8] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
    out[8] = 0;
  }
  else {
    in[8] = 0;
    in[9] = 0;
    in[10] = 0;
    in[0xb] = 0;
    in[0xc] = 0;
    in[0xd] = 0;
    in[0xe] = 0;
    in[0xf] = 0;
    in[0] = 0;
    in[1] = 0;
    in[2] = 0;
    in[3] = 0;
    in[4] = 0;
    in[5] = 0;
    in[6] = 0;
    in[7] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    out[0] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
  }
  uVar11 = 0;
  if ((local_15c != 0xffffffff) &&
     (acStack_b8[(long)local_160 * 4 + (long)(int)local_15c * 8] = cVar19,
     (int)uVar27 <= (int)local_15c)) {
    uVar9 = (ulong)local_15c;
    iVar21 = local_15c + 1;
    uVar10 = 0;
    do {
      lVar7 = (long)local_160 * 4;
      bVar2 = ""[uVar9];
      uVar4 = *(ushort *)(acStack_b8 + uVar9 * 8 + lVar7 + 2);
      uVar16 = -uVar4;
      if (acStack_b8[uVar9 * 8 + lVar7 + 1] == '\0') {
        uVar16 = uVar4;
      }
      out[uVar9] = uVar16;
      uVar10 = uVar10 | uVar4;
      *(ushort *)((long)in + (ulong)((uint)bVar2 * 2)) =
           uVar16 * *(short *)((long)mtx->q_ + (ulong)((uint)bVar2 * 2));
      local_160 = (int)acStack_b8[uVar9 * 8 + lVar7];
      uVar9 = uVar9 - 1;
      iVar21 = iVar21 + -1;
    } while ((int)uVar27 < iVar21);
    uVar11 = (uint)(uVar10 != 0);
  }
  return uVar11;
}

Assistant:

static int TrellisQuantizeBlock(const VP8Encoder* WEBP_RESTRICT const enc,
                                int16_t in[16], int16_t out[16],
                                int ctx0, int coeff_type,
                                const VP8Matrix* WEBP_RESTRICT const mtx,
                                int lambda) {
  const ProbaArray* const probas = enc->proba_.coeffs_[coeff_type];
  CostArrayPtr const costs =
      (CostArrayPtr)enc->proba_.remapped_costs_[coeff_type];
  const int first = (coeff_type == TYPE_I16_AC) ? 1 : 0;
  Node nodes[16][NUM_NODES];
  ScoreState score_states[2][NUM_NODES];
  ScoreState* ss_cur = &SCORE_STATE(0, MIN_DELTA);
  ScoreState* ss_prev = &SCORE_STATE(1, MIN_DELTA);
  int best_path[3] = {-1, -1, -1};   // store best-last/best-level/best-previous
  score_t best_score;
  int n, m, p, last;

  {
    score_t cost;
    const int thresh = mtx->q_[1] * mtx->q_[1] / 4;
    const int last_proba = probas[VP8EncBands[first]][ctx0][0];

    // compute the position of the last interesting coefficient
    last = first - 1;
    for (n = 15; n >= first; --n) {
      const int j = kZigzag[n];
      const int err = in[j] * in[j];
      if (err > thresh) {
        last = n;
        break;
      }
    }
    // we don't need to go inspect up to n = 16 coeffs. We can just go up
    // to last + 1 (inclusive) without losing much.
    if (last < 15) ++last;

    // compute 'skip' score. This is the max score one can do.
    cost = VP8BitCost(0, last_proba);
    best_score = RDScoreTrellis(lambda, cost, 0);

    // initialize source node.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      const score_t rate = (ctx0 == 0) ? VP8BitCost(1, last_proba) : 0;
      ss_cur[m].score = RDScoreTrellis(lambda, rate, 0);
      ss_cur[m].costs = costs[first][ctx0];
    }
  }

  // traverse trellis.
  for (n = first; n <= last; ++n) {
    const int j = kZigzag[n];
    const uint32_t Q  = mtx->q_[j];
    const uint32_t iQ = mtx->iq_[j];
    const uint32_t B = BIAS(0x00);     // neutral bias
    // note: it's important to take sign of the _original_ coeff,
    // so we don't have to consider level < 0 afterward.
    const int sign = (in[j] < 0);
    const uint32_t coeff0 = (sign ? -in[j] : in[j]) + mtx->sharpen_[j];
    int level0 = QUANTDIV(coeff0, iQ, B);
    int thresh_level = QUANTDIV(coeff0, iQ, BIAS(0x80));
    if (thresh_level > MAX_LEVEL) thresh_level = MAX_LEVEL;
    if (level0 > MAX_LEVEL) level0 = MAX_LEVEL;

    {   // Swap current and previous score states
      ScoreState* const tmp = ss_cur;
      ss_cur = ss_prev;
      ss_prev = tmp;
    }

    // test all alternate level values around level0.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      Node* const cur = &NODE(n, m);
      const int level = level0 + m;
      const int ctx = (level > 2) ? 2 : level;
      const int band = VP8EncBands[n + 1];
      score_t base_score;
      score_t best_cur_score;
      int best_prev;
      score_t cost, score;

      ss_cur[m].costs = costs[n + 1][ctx];
      if (level < 0 || level > thresh_level) {
        ss_cur[m].score = MAX_COST;
        // Node is dead.
        continue;
      }

      {
        // Compute delta_error = how much coding this level will
        // subtract to max_error as distortion.
        // Here, distortion = sum of (|coeff_i| - level_i * Q_i)^2
        const int new_error = coeff0 - level * Q;
        const int delta_error =
            kWeightTrellis[j] * (new_error * new_error - coeff0 * coeff0);
        base_score = RDScoreTrellis(lambda, 0, delta_error);
      }

      // Inspect all possible non-dead predecessors. Retain only the best one.
      // The base_score is added to all scores so it is only added for the final
      // value after the loop.
      cost = VP8LevelCost(ss_prev[-MIN_DELTA].costs, level);
      best_cur_score =
          ss_prev[-MIN_DELTA].score + RDScoreTrellis(lambda, cost, 0);
      best_prev = -MIN_DELTA;
      for (p = -MIN_DELTA + 1; p <= MAX_DELTA; ++p) {
        // Dead nodes (with ss_prev[p].score >= MAX_COST) are automatically
        // eliminated since their score can't be better than the current best.
        cost = VP8LevelCost(ss_prev[p].costs, level);
        // Examine node assuming it's a non-terminal one.
        score = ss_prev[p].score + RDScoreTrellis(lambda, cost, 0);
        if (score < best_cur_score) {
          best_cur_score = score;
          best_prev = p;
        }
      }
      best_cur_score += base_score;
      // Store best finding in current node.
      cur->sign = sign;
      cur->level = level;
      cur->prev = best_prev;
      ss_cur[m].score = best_cur_score;

      // Now, record best terminal node (and thus best entry in the graph).
      if (level != 0 && best_cur_score < best_score) {
        const score_t last_pos_cost =
            (n < 15) ? VP8BitCost(0, probas[band][ctx][0]) : 0;
        const score_t last_pos_score = RDScoreTrellis(lambda, last_pos_cost, 0);
        score = best_cur_score + last_pos_score;
        if (score < best_score) {
          best_score = score;
          best_path[0] = n;                     // best eob position
          best_path[1] = m;                     // best node index
          best_path[2] = best_prev;             // best predecessor
        }
      }
    }
  }

  // Fresh start
  // Beware! We must preserve in[0]/out[0] value for TYPE_I16_AC case.
  if (coeff_type == TYPE_I16_AC) {
    memset(in + 1, 0, 15 * sizeof(*in));
    memset(out + 1, 0, 15 * sizeof(*out));
  } else {
    memset(in, 0, 16 * sizeof(*in));
    memset(out, 0, 16 * sizeof(*out));
  }
  if (best_path[0] == -1) {
    return 0;  // skip!
  }

  {
    // Unwind the best path.
    // Note: best-prev on terminal node is not necessarily equal to the
    // best_prev for non-terminal. So we patch best_path[2] in.
    int nz = 0;
    int best_node = best_path[1];
    n = best_path[0];
    NODE(n, best_node).prev = best_path[2];   // force best-prev for terminal

    for (; n >= first; --n) {
      const Node* const node = &NODE(n, best_node);
      const int j = kZigzag[n];
      out[n] = node->sign ? -node->level : node->level;
      nz |= node->level;
      in[j] = out[n] * mtx->q_[j];
      best_node = node->prev;
    }
    return (nz != 0);
  }
}